

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

uint __thiscall
Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::findOrInsert
          (DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *this,uint key,
          uint *val)

{
  Entry *pEVar1;
  uint uVar2;
  uint uVar3;
  uint local_1c;
  
  local_1c = key;
  ensureExpanded(this);
  pEVar1 = findEntryToInsert(this,&local_1c);
  uVar3 = (uint)(pEVar1->field_0)._infoData >> 2;
  uVar2 = this->_timestamp;
  if (((pEVar1->field_0)._infoData & 1U) == 0 && uVar3 == uVar2) {
    uVar2 = pEVar1->_val;
  }
  else {
    if (uVar3 == uVar2) {
      this->_deleted = this->_deleted + -1;
      uVar2 = (pEVar1->field_0)._infoData & 0xfffffffe;
    }
    else {
      uVar2 = uVar2 << 2;
    }
    (pEVar1->field_0)._infoData = uVar2;
    pEVar1->_key = local_1c;
    uVar2 = *val;
    pEVar1->_val = uVar2;
    this->_size = this->_size + 1;
  }
  return uVar2;
}

Assistant:

Val findOrInsert(Key key, const Val& val)
  {
    ensureExpanded();
    Entry* e=findEntryToInsert(key);
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key=key;
      e->_val=val;
      _size++;
    }
    return e->_val;
  }